

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

void duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined1 *puVar1;
  ValidityMask *this;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  unsigned_long *puVar8;
  double *pdVar9;
  list_entry_t *plVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var14;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var15;
  undefined4 uVar18;
  undefined4 uVar19;
  data_ptr_t pdVar16;
  undefined4 uVar20;
  undefined4 uVar21;
  pointer pcVar17;
  byte bVar22;
  double dVar23;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  undefined8 uVar24;
  undefined8 uVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  data_ptr_t pdVar27;
  bool bVar28;
  BoundFunctionExpression *pBVar29;
  reference vec;
  reference vec_00;
  idx_t iVar30;
  idx_t count;
  Vector *this_00;
  Vector *this_01;
  idx_t iVar31;
  TemplatedValidityData<unsigned_long> *pTVar32;
  SelectionVector *pSVar33;
  _Head_base<0UL,_unsigned_long_*,_false> _Var34;
  InvalidInputException *pIVar35;
  SelectionVector *pSVar36;
  SelectionVector *count_00;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  SelectionVector *pSVar41;
  ValidityMask *in_R8;
  idx_t in_R9;
  string *psVar42;
  ulong uVar43;
  idx_t idx_in_entry;
  uint64_t *puVar44;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t lVar45;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  UnifiedVectorFormat ldata;
  double *rhs_data;
  double *lhs_data;
  undefined1 local_138 [16];
  SelectionVector local_128 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  SelectionVector *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  DataChunk *local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  double *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar29 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count_00 = (SelectionVector *)args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_d8 = args;
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar30 = ListVector::GetListSize(vec);
  count = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this_00,iVar30);
  Vector::Flatten(this_01,count);
  FlatVector::VerifyFlatVector(this_00);
  iVar31 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,iVar30);
  if (iVar31 != iVar30) {
    pIVar35 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar17 = (pBVar29->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar17,
               pcVar17 + (pBVar29->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar35,(string *)local_138,&local_50);
    __cxa_throw(pIVar35,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_01);
  iVar30 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_01->validity).super_TemplatedValidityMask<unsigned_long>,count);
  if (iVar30 != count) {
    pIVar35 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar17 = (pBVar29->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar17,
               pcVar17 + (pBVar29->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar35,(string *)local_138,&local_70);
    __cxa_throw(pIVar35,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar42 = &(pBVar29->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_78 = (undefined1  [8])this_00->data;
  local_80 = (double *)this_01->data;
  VVar2 = vec->vector_type;
  VVar3 = vec_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar9 = (double *)result->data;
    if (((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) &&
       ((puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar8 == (unsigned_long *)0x0 || ((*puVar8 & 1) != 0)))) {
      fun.lhs_data = (double **)local_78;
      fun.func_name = psVar42;
      fun.rhs_data = &local_80;
      dVar23 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9);
      *pdVar9 = dVar23;
      goto LAB_01bacd2c;
    }
  }
  else {
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      plVar10 = (list_entry_t *)vec_00->data;
      puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count_00;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count_00;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec->validity,(unsigned_long *)&local_c8
                    );
          uVar25 = local_138._8_8_;
          uVar24 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar32->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count_00[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar42;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              uVar37 = 0;
              pSVar41 = (SelectionVector *)0x0;
              do {
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar33 = (SelectionVector *)
                            &pSVar41[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar33) {
                    pSVar33 = count_00;
                  }
LAB_01bac297:
                  pSVar36 = pSVar41;
                  if (pSVar41 < pSVar33) {
                    lVar45 = *plVar10;
                    puVar44 = (uint64_t *)(pdVar11 + (long)pSVar41 * 0x10 + 8);
                    do {
                      fun_01.lhs_data = (double **)local_78;
                      fun_01.func_name = psVar42;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar44;
                      left_00.offset = puVar44[-1];
                      dVar23 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_01,left_00,lVar45,in_R8,in_R9);
                      *(double *)(pdVar12 + (long)pSVar41 * 8) = dVar23;
                      pSVar41 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar44 = puVar44 + 2;
                      pSVar36 = pSVar33;
                    } while (pSVar33 != pSVar41);
                  }
                }
                else {
                  uVar38 = puVar8[uVar37];
                  pSVar33 = (SelectionVector *)
                            &pSVar41[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar33) {
                    pSVar33 = count_00;
                  }
                  pSVar36 = pSVar33;
                  if (uVar38 != 0) {
                    if (uVar38 == 0xffffffffffffffff) goto LAB_01bac297;
                    pSVar36 = pSVar41;
                    if (pSVar41 < pSVar33) {
                      puVar44 = (uint64_t *)(pdVar11 + (long)pSVar41 * 0x10 + 8);
                      uVar40 = 0;
                      do {
                        if ((uVar38 >> (uVar40 & 0x3f) & 1) != 0) {
                          fun_00.lhs_data = (double **)local_78;
                          fun_00.func_name = psVar42;
                          fun_00.rhs_data = &local_80;
                          left.length = *puVar44;
                          left.offset = puVar44[-1];
                          dVar23 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_00,left,*plVar10,in_R8,in_R9);
                          *(double *)(pdVar12 + uVar40 * 8 + (long)pSVar41 * 8) = dVar23;
                        }
                        uVar40 = uVar40 + 1;
                        puVar44 = puVar44 + 2;
                        pSVar36 = pSVar33;
                      } while ((long)pSVar33 - (long)pSVar41 != uVar40);
                    }
                  }
                }
                uVar37 = uVar37 + 1;
                pSVar41 = pSVar36;
              } while (uVar37 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bacd2c;
          }
        }
        local_138._0_8_ = psVar42;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count_00 != (SelectionVector *)0x0) {
          lVar45 = *plVar10;
          puVar44 = (uint64_t *)(pdVar11 + 8);
          pSVar41 = (SelectionVector *)0x0;
          do {
            fun_05.lhs_data = (double **)local_138._8_8_;
            fun_05.func_name = (string *)local_138._0_8_;
            fun_05.rhs_data = (double **)local_128[0].sel_vector;
            left_02.length = *puVar44;
            left_02.offset = puVar44[-1];
            dVar23 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_05,left_02,lVar45,in_R8,in_R9);
            *(double *)(pdVar12 + (long)pSVar41 * 8) = dVar23;
            pSVar41 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            puVar44 = puVar44 + 2;
          } while (count_00 != pSVar41);
        }
        goto LAB_01bacd2c;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_138);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,(idx_t)count_00,(UnifiedVectorFormat *)local_138);
          Vector::ToUnifiedFormat(vec_00,(idx_t)count_00,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = local_c8.data;
          pSVar41 = local_c8.sel;
          uVar25 = local_138._8_8_;
          uVar24 = local_138._0_8_;
          pdVar11 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 && (double **)local_128[0].sel_vector == (double **)0x0) {
            if (count_00 != (SelectionVector *)0x0) {
              lVar39 = *(long *)uVar24;
              _Var15._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              pSVar41 = (SelectionVector *)0x0;
              do {
                pSVar33 = pSVar41;
                if (lVar39 != 0) {
                  pSVar33 = (SelectionVector *)(ulong)*(uint *)(lVar39 + (long)pSVar41 * 4);
                }
                pSVar36 = pSVar41;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var15._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar36 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var15._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar41 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))
                        ->_M_use_count;
                uVar18 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))
                         ->_M_weak_count;
                left_01.length._4_4_ = uVar18;
                left_01.length._0_4_ = uVar4;
                uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar36 * 0x10))->_M_use_count;
                uVar19 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar36 * 0x10))->_M_weak_count;
                right.length._4_4_ = uVar19;
                right.length._0_4_ = uVar5;
                fun_02.lhs_data = (double **)local_78;
                fun_02.func_name = psVar42;
                fun_02.rhs_data = &local_80;
                left_01.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))->
                     _vptr__Sp_counted_base;
                right.offset = (uint64_t)
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pdVar12 + pSVar36 * 0x10))->_vptr__Sp_counted_base;
                dVar23 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_02,left_01,right,in_R8,in_R9);
                *(double *)(pdVar11 + (long)pSVar41 * 8) = dVar23;
                pSVar41 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
              } while (count_00 != pSVar41);
            }
          }
          else if (count_00 != (SelectionVector *)0x0) {
            lVar39 = *(long *)uVar24;
            _Var15._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pSVar41 = (SelectionVector *)0x0;
            do {
              pSVar33 = pSVar41;
              if (lVar39 != 0) {
                pSVar33 = (SelectionVector *)(ulong)*(uint *)(lVar39 + (long)pSVar41 * 4);
              }
              pSVar36 = pSVar41;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var15._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar36 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var15._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar41 * 4);
              }
              if ((((double **)local_128[0].sel_vector == (double **)0x0) ||
                  (((ulong)*(double **)((long)local_128[0].sel_vector + ((ulong)pSVar33 >> 6) * 8)
                    >> ((ulong)pSVar33 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar36 >> 6] >> ((ulong)pSVar36 & 0x3f) & 1) != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))
                        ->_M_use_count;
                uVar20 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar20;
                left_03.length._0_4_ = uVar6;
                uVar7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar36 * 0x10))->_M_use_count;
                uVar21 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar36 * 0x10))->_M_weak_count;
                right_01.length._4_4_ = uVar21;
                right_01.length._0_4_ = uVar7;
                fun_06.lhs_data = (double **)local_78;
                fun_06.func_name = psVar42;
                fun_06.rhs_data = &local_80;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar25 + pSVar33 * 0x10))->
                     _vptr__Sp_counted_base;
                right_01.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pdVar12 + pSVar36 * 0x10))->_vptr__Sp_counted_base;
                dVar23 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_06,left_03,right_01,in_R8,in_R9);
                *(double *)(pdVar11 + (long)pSVar41 * 8) = dVar23;
              }
              else {
                _Var34._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var34._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var26 = p_Stack_e0;
                  pSVar33 = local_e8;
                  local_e8 = (SelectionVector *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar33;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var26;
                  if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var34._M_head_impl =
                       (pTVar32->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var34._M_head_impl;
                }
                bVar22 = (byte)pSVar41 & 0x3f;
                _Var34._M_head_impl[(ulong)pSVar41 >> 6] =
                     _Var34._M_head_impl[(ulong)pSVar41 >> 6] &
                     (-2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22);
              }
              pSVar41 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
            } while (count_00 != pSVar41);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
          }
          if (local_128[0].selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128[0].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_01bacd2c;
        }
        pdVar11 = vec->data;
        pdVar12 = vec_00->data;
        local_138._0_8_ = psVar42;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar16 = result->data;
        FlatVector::VerifyFlatVector(result);
        this = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        local_e8 = count_00;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
LAB_01bacab9:
          FlatVector::VerifyFlatVector(vec_00);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
          if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8 = count_00;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var34._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_e8 = count_00;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vec_00->validity,
                       (unsigned_long *)&local_e8);
            pdVar27 = local_c8.data;
            pSVar41 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar41;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
            if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var34._M_head_impl =
                 (pTVar32->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var34._M_head_impl;
        }
        else {
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vec->validity,(unsigned_long *)&local_e8
                    );
          pdVar27 = local_c8.data;
          pSVar41 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar41;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar32->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
              (unsigned_long *)0x0) goto LAB_01bacab9;
          FlatVector::VerifyFlatVector(vec_00);
          ValidityMask::Combine(this,&vec_00->validity,(idx_t)count_00);
          _Var34._M_head_impl = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        }
        if (_Var34._M_head_impl == (unsigned_long *)0x0) {
          if (count_00 != (SelectionVector *)0x0) {
            lVar39 = 0;
            do {
              fun_10.lhs_data = (double **)local_138._8_8_;
              fun_10.func_name = (string *)local_138._0_8_;
              fun_10.rhs_data = (double **)local_128[0].sel_vector;
              left_06.length = *(uint64_t *)(pdVar11 + lVar39 * 2 + 8);
              left_06.offset = *(uint64_t *)(pdVar11 + lVar39 * 2);
              right_05.length = *(uint64_t *)(pdVar12 + lVar39 * 2 + 8);
              right_05.offset = *(uint64_t *)(pdVar12 + lVar39 * 2);
              dVar23 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_10,left_06,right_05,in_R8,in_R9);
              *(double *)(pdVar16 + lVar39) = dVar23;
              lVar39 = lVar39 + 8;
              count_00 = (SelectionVector *)
                         ((long)&count_00[-1].selection_data.internal.
                                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7);
            } while (count_00 != (SelectionVector *)0x0);
          }
        }
        else {
          puVar1 = (undefined1 *)
                   ((long)&count_00[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar1) {
            pSVar41 = (SelectionVector *)0x0;
            uVar37 = 0;
            do {
              puVar8 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                pSVar33 = (SelectionVector *)
                          &pSVar41[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count_00 <= pSVar33) {
                  pSVar33 = count_00;
                }
LAB_01bacbd4:
                pSVar36 = pSVar41;
                if (pSVar41 < pSVar33) {
                  uVar38 = (long)pSVar41 << 4 | 8;
                  do {
                    fun_08.lhs_data = (double **)local_138._8_8_;
                    fun_08.func_name = (string *)local_138._0_8_;
                    fun_08.rhs_data = (double **)local_128[0].sel_vector;
                    left_04.length = *(uint64_t *)(pdVar11 + uVar38);
                    left_04.offset = *(uint64_t *)(pdVar11 + (uVar38 - 8));
                    right_03.length = *(uint64_t *)(pdVar12 + uVar38);
                    right_03.offset = *(uint64_t *)(pdVar12 + (uVar38 - 8));
                    dVar23 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_08,left_04,right_03,in_R8,in_R9);
                    *(double *)(pdVar16 + (long)pSVar41 * 8) = dVar23;
                    pSVar41 = (SelectionVector *)
                              ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)
                                      ->
                                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                      )._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t + 1);
                    uVar38 = uVar38 + 0x10;
                    pSVar36 = pSVar33;
                  } while (pSVar33 != pSVar41);
                }
              }
              else {
                uVar38 = puVar8[uVar37];
                pSVar33 = (SelectionVector *)
                          &pSVar41[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count_00 <= pSVar33) {
                  pSVar33 = count_00;
                }
                pSVar36 = pSVar33;
                if (uVar38 != 0) {
                  if (uVar38 == 0xffffffffffffffff) goto LAB_01bacbd4;
                  pSVar36 = pSVar41;
                  if (pSVar41 < pSVar33) {
                    uVar43 = (long)pSVar41 << 4 | 8;
                    uVar40 = 0;
                    do {
                      if ((uVar38 >> (uVar40 & 0x3f) & 1) != 0) {
                        fun_09.lhs_data = (double **)local_138._8_8_;
                        fun_09.func_name = (string *)local_138._0_8_;
                        fun_09.rhs_data = (double **)local_128[0].sel_vector;
                        left_05.length = *(uint64_t *)(pdVar11 + uVar43);
                        left_05.offset = *(uint64_t *)(pdVar11 + (uVar43 - 8));
                        right_04.length = *(uint64_t *)(pdVar12 + uVar43);
                        right_04.offset = *(uint64_t *)(pdVar12 + (uVar43 - 8));
                        dVar23 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                           (fun_09,left_05,right_04,in_R8,in_R9);
                        *(double *)(pdVar16 + uVar40 * 8 + (long)pSVar41 * 8) = dVar23;
                      }
                      uVar40 = uVar40 + 1;
                      uVar43 = uVar43 + 0x10;
                      pSVar36 = pSVar33;
                    } while ((long)pSVar33 - (long)pSVar41 != uVar40);
                  }
                }
              }
              pSVar41 = pSVar36;
              uVar37 = uVar37 + 1;
            } while (uVar37 != (ulong)puVar1 >> 6);
          }
        }
        goto LAB_01bacd2c;
      }
      plVar10 = (list_entry_t *)vec->data;
      puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec_00->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count_00;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count_00;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec_00->validity,
                     (unsigned_long *)&local_c8);
          uVar25 = local_138._8_8_;
          uVar24 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar32->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count_00[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar42;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              uVar37 = 0;
              pSVar41 = (SelectionVector *)0x0;
              do {
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar33 = (SelectionVector *)
                            &pSVar41[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar33) {
                    pSVar33 = count_00;
                  }
LAB_01bac608:
                  pSVar36 = pSVar41;
                  if (pSVar41 < pSVar33) {
                    lVar45 = *plVar10;
                    puVar44 = (uint64_t *)(pdVar11 + (long)pSVar41 * 0x10 + 8);
                    do {
                      fun_04.lhs_data = (double **)local_78;
                      fun_04.func_name = psVar42;
                      fun_04.rhs_data = &local_80;
                      right_00.length = *puVar44;
                      right_00.offset = puVar44[-1];
                      dVar23 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_04,lVar45,right_00,in_R8,in_R9);
                      *(double *)(pdVar12 + (long)pSVar41 * 8) = dVar23;
                      pSVar41 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar44 = puVar44 + 2;
                      pSVar36 = pSVar33;
                    } while (pSVar33 != pSVar41);
                  }
                }
                else {
                  uVar38 = puVar8[uVar37];
                  pSVar33 = (SelectionVector *)
                            &pSVar41[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar33) {
                    pSVar33 = count_00;
                  }
                  pSVar36 = pSVar33;
                  if (uVar38 != 0) {
                    if (uVar38 == 0xffffffffffffffff) goto LAB_01bac608;
                    pSVar36 = pSVar41;
                    if (pSVar41 < pSVar33) {
                      puVar44 = (uint64_t *)(pdVar11 + (long)pSVar41 * 0x10 + 8);
                      uVar40 = 0;
                      do {
                        if ((uVar38 >> (uVar40 & 0x3f) & 1) != 0) {
                          fun_03.lhs_data = (double **)local_78;
                          fun_03.func_name = psVar42;
                          fun_03.rhs_data = &local_80;
                          lVar45.length = *puVar44;
                          lVar45.offset = puVar44[-1];
                          dVar23 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_03,*plVar10,lVar45,in_R8,in_R9);
                          *(double *)(pdVar12 + uVar40 * 8 + (long)pSVar41 * 8) = dVar23;
                        }
                        uVar40 = uVar40 + 1;
                        puVar44 = puVar44 + 2;
                        pSVar36 = pSVar33;
                      } while ((long)pSVar33 - (long)pSVar41 != uVar40);
                    }
                  }
                }
                uVar37 = uVar37 + 1;
                pSVar41 = pSVar36;
              } while (uVar37 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bacd2c;
          }
        }
        local_138._0_8_ = psVar42;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count_00 != (SelectionVector *)0x0) {
          lVar45 = *plVar10;
          puVar44 = (uint64_t *)(pdVar11 + 8);
          pSVar41 = (SelectionVector *)0x0;
          do {
            fun_07.lhs_data = (double **)local_138._8_8_;
            fun_07.func_name = (string *)local_138._0_8_;
            fun_07.rhs_data = (double **)local_128[0].sel_vector;
            right_02.length = *puVar44;
            right_02.offset = puVar44[-1];
            dVar23 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_07,lVar45,right_02,in_R8,in_R9);
            *(double *)(pdVar12 + (long)pSVar41 * 8) = dVar23;
            pSVar41 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar41->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            puVar44 = puVar44 + 2;
          } while (count_00 != pSVar41);
        }
        goto LAB_01bacd2c;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01bacd2c:
  bVar28 = DataChunk::AllConstant(local_d8);
  if (bVar28) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}